

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O1

Vec_Ptr_t * Saig_ManWindowCollectPos(Aig_Man_t *p,Vec_Ptr_t *vNodes,Vec_Ptr_t **pvPointers)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  long lVar8;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  pVVar3->pArray = ppvVar4;
  if (pvPointers != (Vec_Ptr_t **)0x0) {
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nCap = 1000;
    pVVar5->nSize = 0;
    ppvVar4 = (void **)malloc(8000);
    pVVar5->pArray = ppvVar4;
    *pvPointers = pVVar5;
  }
  if (0 < vNodes->nSize) {
    lVar8 = 0;
    do {
      pObj = (Aig_Obj_t *)vNodes->pArray[lVar8];
      pAVar6 = Saig_ObjHasUnlabeledFanout(p,pObj);
      if (pAVar6 != (Aig_Obj_t *)0x0) {
        uVar1 = pVVar3->nSize;
        uVar2 = pVVar3->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar2 * 2;
            if (iVar7 <= (int)uVar2) goto LAB_006f8b0b;
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = iVar7;
        }
LAB_006f8b0b:
        pVVar3->nSize = uVar1 + 1;
        pVVar3->pArray[(int)uVar1] = pObj;
        if (pvPointers != (Vec_Ptr_t **)0x0) {
          pVVar5 = *pvPointers;
          uVar1 = pVVar5->nCap;
          if (pVVar5->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
              }
              pVVar5->pArray = ppvVar4;
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar1 * 2;
              if (iVar7 <= (int)uVar1) goto LAB_006f8b9f;
              if (pVVar5->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
              }
              pVVar5->pArray = ppvVar4;
            }
            pVVar5->nCap = iVar7;
          }
LAB_006f8b9f:
          iVar7 = pVVar5->nSize;
          pVVar5->nSize = iVar7 + 1;
          pVVar5->pArray[iVar7] = pAVar6;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vNodes->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Saig_ManWindowCollectPos( Aig_Man_t * p, Vec_Ptr_t * vNodes, Vec_Ptr_t ** pvPointers )
{
    Vec_Ptr_t * vNodesPo;
    Aig_Obj_t * pObj, * pPointer;
    int i;
    vNodesPo = Vec_PtrAlloc( 1000 );
    if ( pvPointers )
        *pvPointers = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( (pPointer = Saig_ObjHasUnlabeledFanout(p, pObj)) )
        {
            Vec_PtrPush( vNodesPo, pObj );
            if ( pvPointers )
                Vec_PtrPush( *pvPointers, pPointer );
        }
    }
    return vNodesPo;
}